

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

Status absl::lts_20250127::ErrnoToStatus(int error_number,string_view message)

{
  StatusCode code;
  int errnum;
  undefined4 in_register_0000003c;
  AlphaNum *in_R8;
  string_view msg;
  string local_100;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  char *local_60 [6];
  
  code = ErrnoToStatusCode((uint)message._M_len);
  local_90.piece_._M_len = 2;
  local_90.piece_._M_str = ": ";
  local_60[0] = message._M_str;
  base_internal::StrError_abi_cxx11_(&local_e0,(base_internal *)(ulong)(uint)message._M_len,errnum);
  local_c0.piece_._M_len = local_e0._M_string_length;
  local_c0.piece_._M_str = local_e0._M_dataplus._M_p;
  StrCat_abi_cxx11_(&local_100,(lts_20250127 *)local_60,&local_90,&local_c0,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  msg._M_str = local_100._M_dataplus._M_p;
  msg._M_len = local_100._M_string_length;
  Status::Status((Status *)CONCAT44(in_register_0000003c,error_number),code,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return (Status)(uintptr_t)CONCAT44(in_register_0000003c,error_number);
}

Assistant:

Status ErrnoToStatus(int error_number, absl::string_view message) {
  return Status(ErrnoToStatusCode(error_number),
                MessageForErrnoToStatus(error_number, message));
}